

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BailOut.cpp
# Opt level: O3

void __thiscall LazyBailOutRecord::Dump(LazyBailOutRecord *this,FunctionBody *functionBody)

{
  uint uVar1;
  code *pcVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  undefined4 extraout_var;
  undefined4 *puVar6;
  FunctionInfo *pFVar7;
  char16 *pcVar8;
  
  iVar4 = (*(functionBody->super_ParseableFunctionInfo).super_FunctionProxy.super_FinalizableObject.
            super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7])(functionBody);
  uVar5 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)functionBody);
  pFVar7 = (functionBody->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
  if (pFVar7 == (FunctionInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/../Runtime/Base/FunctionBody.h"
                       ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar6 = 0;
    pFVar7 = (functionBody->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
  }
  Output::Print(L"Function %s (#%d.%u, #%u) ",CONCAT44(extraout_var,iVar4),(ulong)uVar5,
                (ulong)pFVar7->functionId,
                (ulong)(functionBody->super_ParseableFunctionInfo).super_FunctionProxy.
                       m_functionNumber);
  uVar1 = this->bailOutRecord->bailOutOffset;
  pcVar8 = Js::OpCodeUtil::GetOpCodeName(this->bailOutRecord->bailOutOpcode);
  Output::Print(L"Bytecode Offset: #%04x opcode: %s",(ulong)uVar1,pcVar8);
  return;
}

Assistant:

void LazyBailOutRecord::Dump(Js::FunctionBody* functionBody) const
{
    OUTPUT_PRINT(functionBody);
    Output::Print(_u("Bytecode Offset: #%04x opcode: %s"), this->bailOutRecord->GetBailOutOffset(), Js::OpCodeUtil::GetOpCodeName(this->bailOutRecord->GetBailOutOpCode()));
}